

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool __thiscall tinyusdz::Layer::check_unresolved_specializes(Layer *this,uint32_t max_depth)

{
  bool bVar1;
  reference_conflict pvVar2;
  value_type_conflict *item;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *__range1;
  bool ret;
  uint32_t max_depth_local;
  Layer *this_local;
  
  __range1._3_1_ = false;
  __end1 = ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    *)&this->_prim_specs);
  item = (value_type_conflict *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                *)&this->_prim_specs);
  do {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                        *)&__end1,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                        *)&item);
    if (!bVar1) {
LAB_00374e08:
      this->_has_unresolved_specializes = __range1._3_1_;
      return (bool)(this->_has_unresolved_specializes & 1);
    }
    pvVar2 = ::std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
             ::operator*(&__end1);
    bVar1 = anon_unknown_237::HasSpecializesRec(0,&pvVar2->second,max_depth);
    if (bVar1) {
      __range1._3_1_ = true;
      goto LAB_00374e08;
    }
    ::std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Layer::check_unresolved_specializes(const uint32_t max_depth) const {
  bool ret = false;

  for (const auto &item : _prim_specs) {
    if (HasSpecializesRec(/* depth */ 0, item.second, max_depth)) {
      ret = true;
      break;
    }
  }

  _has_unresolved_specializes = ret;
  return _has_unresolved_specializes;
}